

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O0

int __thiscall
ncnn::Reshape::eval_shape_expr
          (Reshape *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,int *outw,
          int *outh,int *outd,int *outc)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  value_type *in_RCX;
  value_type *in_RDX;
  value_type *in_R8;
  value_type *in_R9;
  int er;
  vector<int,_std::allocator<int>_> shape;
  vector<int,_std::allocator<int>_> *in_stack_00000340;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_00000348;
  string *in_stack_00000350;
  undefined4 in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> local_50;
  value_type *local_38;
  value_type *local_30;
  value_type *local_28;
  value_type *local_20;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0xf7cede);
  iVar1 = eval_list_expression(in_stack_00000350,in_stack_00000348,in_stack_00000340);
  if (iVar1 == 0) {
    *local_20 = 1;
    *local_28 = 1;
    *local_30 = 1;
    *local_38 = 1;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_50);
    if (sVar2 == 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,0);
      *local_20 = *pvVar3;
    }
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_50);
    if (sVar2 == 2) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,0);
      *local_20 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,1);
      *local_28 = *pvVar3;
    }
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_50);
    if (sVar2 == 3) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,0);
      *local_20 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,1);
      *local_28 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,2);
      *local_38 = *pvVar3;
    }
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_50);
    if (sVar2 == 4) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,0);
      *local_20 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,1);
      *local_28 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,2);
      *local_30 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_50,3);
      *local_38 = *pvVar3;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar1,in_stack_ffffffffffffff90));
  return local_4;
}

Assistant:

int Reshape::eval_shape_expr(const std::vector<Mat>& bottom_blobs, int& outw, int& outh, int& outd, int& outc) const
{
    // [size(@0,0),size(@0,1),12,64]
    std::vector<int> shape;
    int er = eval_list_expression(shape_expr, bottom_blobs, shape);
    if (er != 0)
        return -1;

    outw = 1;
    outh = 1;
    outd = 1;
    outc = 1;
    if (shape.size() == 1)
    {
        outw = shape[0];
    }
    if (shape.size() == 2)
    {
        outw = shape[0];
        outh = shape[1];
    }
    if (shape.size() == 3)
    {
        outw = shape[0];
        outh = shape[1];
        outc = shape[2];
    }
    if (shape.size() == 4)
    {
        outw = shape[0];
        outh = shape[1];
        outd = shape[2];
        outc = shape[3];
    }

    return 0;
}